

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  FirstMatchSequenceExprSyntax *pFVar1;
  DeepCloneVisitor visitor;
  Token local_58;
  Token local_48;
  Token local_38;
  SequenceMatchListSyntax *local_28;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_58,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x40) == (SyntaxNode *)0x0) {
    local_28 = (SequenceMatchListSyntax *)0x0;
  }
  else {
    local_28 = (SequenceMatchListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x40),(DeepCloneVisitor *)&local_58,
                          (BumpAllocator *)__child_stack);
  }
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x48),(BumpAllocator *)__child_stack);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::FirstMatchSequenceExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SequenceExprSyntax&,slang::syntax::SequenceMatchListSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,&local_48,
                      (SequenceExprSyntax *)args_2,&local_28,&local_58);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const FirstMatchSequenceExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<FirstMatchSequenceExprSyntax>(
        node.first_match.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<SequenceExprSyntax>(*node.expr, alloc),
        node.matchList ? deepClone(*node.matchList, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}